

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_change_config_seq(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf,_Bool *is_sb_size_changed)

{
  BLOCK_SIZE BVar1;
  BLOCK_SIZE sb_size_00;
  undefined1 *in_RDX;
  AV1EncoderConfig *in_RSI;
  AV1_PRIMARY *in_RDI;
  int i;
  int sb_size;
  ColorCfg *color_cfg;
  DecoderModelCfg *dec_model_cfg;
  FrameDimensionCfg *frm_dim_cfg;
  SequenceHeader *seq_params;
  int local_4c;
  int local_40;
  AV1EncoderConfig *oxcf_00;
  AV1_PRIMARY *seq_params_00;
  AV1_PRIMARY *ppi_00;
  
  seq_params_00 = (AV1_PRIMARY *)&in_RDI->seq_params;
  oxcf_00 = (AV1EncoderConfig *)&in_RSI->frm_dim_cfg;
  if ((in_RDI->seq_params).profile != in_RSI->profile) {
    (in_RDI->seq_params).profile = in_RSI->profile;
  }
  (in_RDI->seq_params).bit_depth = (in_RSI->tool_cfg).bit_depth;
  (in_RDI->seq_params).color_primaries = (in_RSI->color_cfg).color_primaries;
  (in_RDI->seq_params).transfer_characteristics = (in_RSI->color_cfg).transfer_characteristics;
  (in_RDI->seq_params).matrix_coefficients = (in_RSI->color_cfg).matrix_coefficients;
  (in_RDI->seq_params).monochrome = (in_RSI->tool_cfg).enable_monochrome & 1;
  (in_RDI->seq_params).chroma_sample_position = (in_RSI->color_cfg).chroma_sample_position;
  (in_RDI->seq_params).color_range = (in_RSI->color_cfg).color_range;
  (in_RDI->seq_params).timing_info_present = (uint)((in_RSI->dec_model_cfg).timing_info_present & 1)
  ;
  (in_RDI->seq_params).timing_info.num_units_in_display_tick =
       (in_RSI->dec_model_cfg).timing_info.num_units_in_display_tick;
  (in_RDI->seq_params).timing_info.time_scale = (in_RSI->dec_model_cfg).timing_info.time_scale;
  (in_RDI->seq_params).timing_info.equal_picture_interval =
       (in_RSI->dec_model_cfg).timing_info.equal_picture_interval;
  (in_RDI->seq_params).timing_info.num_ticks_per_picture =
       (in_RSI->dec_model_cfg).timing_info.num_ticks_per_picture;
  (in_RDI->seq_params).display_model_info_present_flag =
       (in_RSI->dec_model_cfg).display_model_info_present_flag & 1;
  (in_RDI->seq_params).decoder_model_info_present_flag =
       (in_RSI->dec_model_cfg).decoder_model_info_present_flag & 1;
  if (((in_RSI->dec_model_cfg).decoder_model_info_present_flag & 1U) == 0) {
    if ((((in_RDI->seq_params).timing_info_present == 0) ||
        ((in_RDI->seq_params).timing_info.equal_picture_interval == 0)) ||
       ((in_RDI->seq_params).decoder_model_info_present_flag != '\0')) {
      (in_RDI->seq_params).op_params[0].initial_display_delay = 10;
    }
    else {
      av1_set_resource_availability_parameters((in_RDI->seq_params).op_params);
    }
  }
  else {
    (in_RDI->seq_params).decoder_model_info.num_units_in_decoding_tick =
         (in_RSI->dec_model_cfg).num_units_in_decoding_tick;
    in_RDI->buffer_removal_time_present = true;
    av1_set_aom_dec_model_info(&(in_RDI->seq_params).decoder_model_info);
    av1_set_dec_model_op_parameters((aom_dec_model_op_parameters_t *)&seq_params_00->cpi_lap);
  }
  av1_update_film_grain_parameters_seq(in_RDI,in_RSI);
  BVar1 = *(BLOCK_SIZE *)((long)seq_params_00->parallel_cpi + 0x1c);
  ppi_00 = seq_params_00;
  if (in_RDI->seq_params_locked == 0) {
    sb_size_00 = av1_select_sb_size(in_RSI,*(int *)&(oxcf_00->input_cfg).init_framerate,
                                    *(int *)((long)&(oxcf_00->input_cfg).init_framerate + 4),
                                    in_RDI->number_spatial_layers);
    set_sb_size((SequenceHeader *)seq_params_00,sb_size_00);
    for (local_40 = 0; local_40 < 0x20; local_40 = local_40 + 1) {
      *(byte *)((long)ppi_00->filter_level + (long)local_40 + -0xb) =
           (byte)(in_RSI->tier_mask >> ((byte)local_40 & 0x1f)) & 1;
    }
  }
  if ((in_RDX != (undefined1 *)0x0) && (BVar1 != *(BLOCK_SIZE *)((long)ppi_00->parallel_cpi + 0x1c))
     ) {
    *in_RDX = 1;
  }
  if (in_RDI->seq_params_locked == 0) {
    if ((in_RDI->number_spatial_layers < 2) && (in_RDI->number_temporal_layers < 2)) {
      local_4c = 0;
    }
    else {
      local_4c = in_RDI->number_spatial_layers * in_RDI->number_temporal_layers + -1;
    }
    *(int *)&ppi_00->parallel_frames_data[1].cx_data_sz = local_4c;
    init_seq_coding_tools(ppi_00,oxcf_00,(int)((ulong)&in_RSI->dec_model_cfg >> 0x20));
  }
  *(uint *)ppi_00->ref_frame_map_copy =
       (uint)((*(char *)((long)&ppi_00->parallel_frames_data[0].lib_flags + 2) != '\0' ^ 0xffU) & 1)
       & *(uint *)ppi_00->ref_frame_map_copy;
  highbd_set_var_fns(in_RDI);
  set_primary_rc_buffer_sizes(in_RSI,in_RDI);
  return;
}

Assistant:

void av1_change_config_seq(struct AV1_PRIMARY *ppi,
                           const AV1EncoderConfig *oxcf,
                           bool *is_sb_size_changed) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  const FrameDimensionCfg *const frm_dim_cfg = &oxcf->frm_dim_cfg;
  const DecoderModelCfg *const dec_model_cfg = &oxcf->dec_model_cfg;
  const ColorCfg *const color_cfg = &oxcf->color_cfg;

  if (seq_params->profile != oxcf->profile) seq_params->profile = oxcf->profile;
  seq_params->bit_depth = oxcf->tool_cfg.bit_depth;
  seq_params->color_primaries = color_cfg->color_primaries;
  seq_params->transfer_characteristics = color_cfg->transfer_characteristics;
  seq_params->matrix_coefficients = color_cfg->matrix_coefficients;
  seq_params->monochrome = oxcf->tool_cfg.enable_monochrome;
  seq_params->chroma_sample_position = color_cfg->chroma_sample_position;
  seq_params->color_range = color_cfg->color_range;

  assert(IMPLIES(seq_params->profile <= PROFILE_1,
                 seq_params->bit_depth <= AOM_BITS_10));

  seq_params->timing_info_present = dec_model_cfg->timing_info_present;
  seq_params->timing_info.num_units_in_display_tick =
      dec_model_cfg->timing_info.num_units_in_display_tick;
  seq_params->timing_info.time_scale = dec_model_cfg->timing_info.time_scale;
  seq_params->timing_info.equal_picture_interval =
      dec_model_cfg->timing_info.equal_picture_interval;
  seq_params->timing_info.num_ticks_per_picture =
      dec_model_cfg->timing_info.num_ticks_per_picture;

  seq_params->display_model_info_present_flag =
      dec_model_cfg->display_model_info_present_flag;
  seq_params->decoder_model_info_present_flag =
      dec_model_cfg->decoder_model_info_present_flag;
  if (dec_model_cfg->decoder_model_info_present_flag) {
    // set the decoder model parameters in schedule mode
    seq_params->decoder_model_info.num_units_in_decoding_tick =
        dec_model_cfg->num_units_in_decoding_tick;
    ppi->buffer_removal_time_present = 1;
    av1_set_aom_dec_model_info(&seq_params->decoder_model_info);
    av1_set_dec_model_op_parameters(&seq_params->op_params[0]);
  } else if (seq_params->timing_info_present &&
             seq_params->timing_info.equal_picture_interval &&
             !seq_params->decoder_model_info_present_flag) {
    // set the decoder model parameters in resource availability mode
    av1_set_resource_availability_parameters(&seq_params->op_params[0]);
  } else {
    seq_params->op_params[0].initial_display_delay =
        10;  // Default value (not signaled)
  }

#if !CONFIG_REALTIME_ONLY
  av1_update_film_grain_parameters_seq(ppi, oxcf);
#endif

  int sb_size = seq_params->sb_size;
  // Superblock size should not be updated after the first key frame.
  if (!ppi->seq_params_locked) {
    set_sb_size(seq_params, av1_select_sb_size(oxcf, frm_dim_cfg->width,
                                               frm_dim_cfg->height,
                                               ppi->number_spatial_layers));
    for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i)
      seq_params->tier[i] = (oxcf->tier_mask >> i) & 1;
  }
  if (is_sb_size_changed != NULL && sb_size != seq_params->sb_size)
    *is_sb_size_changed = true;

  // Init sequence level coding tools
  // This should not be called after the first key frame.
  // Note that for SVC encoding the sequence parameters
  // (operating_points_cnt_minus_1, operating_point_idc[],
  // has_nonzero_operating_point_idc) should be updated whenever the
  // number of layers is changed. This is done in the
  // ctrl_set_svc_params().
  if (!ppi->seq_params_locked) {
    seq_params->operating_points_cnt_minus_1 =
        (ppi->number_spatial_layers > 1 || ppi->number_temporal_layers > 1)
            ? ppi->number_spatial_layers * ppi->number_temporal_layers - 1
            : 0;
    init_seq_coding_tools(ppi, oxcf,
                          ppi->use_svc || ppi->rtc_ref.set_ref_frame_config);
  }
  seq_params->timing_info_present &= !seq_params->reduced_still_picture_hdr;

#if CONFIG_AV1_HIGHBITDEPTH
  highbd_set_var_fns(ppi);
#endif

  set_primary_rc_buffer_sizes(oxcf, ppi);
}